

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNullInLargeMap(ExtensionSet *this,int key)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  if (this->flat_capacity_ < 0x101) {
    __assert_fail("is_large()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
                  ,0x715,
                  "const ExtensionSet::Extension *google::protobuf::internal::ExtensionSet::FindOrNullInLargeMap(int) const"
                 );
  }
  p_Var2 = (((this->map_).large)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(((this->map_).large)->_M_t)._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (key <= (int)p_Var2[1]._M_color) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < key];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      if (key < (int)p_Var3[1]._M_color) {
        return (Extension *)0x0;
      }
      return (Extension *)&p_Var3[1]._M_parent;
    }
  }
  return (Extension *)0x0;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNullInLargeMap(
    int key) const {
  assert(is_large());
  LargeMap::const_iterator it = map_.large->find(key);
  if (it != map_.large->end()) {
    return &it->second;
  }
  return NULL;
}